

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O2

QList<QSslCertificate> *
QSslCertificate::fromData
          (QList<QSslCertificate> *__return_storage_ptr__,QByteArray *data,EncodingFormat format)

{
  QTlsBackend *pQVar1;
  code *pcVar2;
  QLoggingCategory *pQVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QTlsBackend::activeOrAnyBackend();
  if (pQVar1 == (QTlsBackend *)0x0) {
    pQVar3 = QtPrivateLogging::lcSsl();
    if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_28 = pQVar3->name;
      pcVar4 = "No TLS backend is available";
LAB_001bf7bb:
      local_40[0x14] = '\0';
      local_40[0x15] = '\0';
      local_40[0x16] = '\0';
      local_40[0x17] = '\0';
      local_40[0xc] = '\0';
      local_40[0xd] = '\0';
      local_40[0xe] = '\0';
      local_40[0xf] = '\0';
      local_40[0x10] = '\0';
      local_40[0x11] = '\0';
      local_40[0x12] = '\0';
      local_40[0x13] = '\0';
      local_40[4] = '\0';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      local_40[8] = '\0';
      local_40[9] = '\0';
      local_40[10] = '\0';
      local_40[0xb] = '\0';
      local_40[0] = '\x02';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      QMessageLogger::warning(local_40,pcVar4);
    }
  }
  else {
    pcVar2 = (code *)(**(code **)(*(long *)pQVar1 + 0xe8 + (ulong)(format != Pem) * 8))(pQVar1);
    if (pcVar2 != (code *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        (*pcVar2)(__return_storage_ptr__,data,0xffffffffffffffff);
        return __return_storage_ptr__;
      }
      goto LAB_001bf7c4;
    }
    pQVar3 = QtPrivateLogging::lcSsl();
    if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_28 = pQVar3->name;
      pcVar4 = "The available TLS backend does not support reading PEM/DER";
      goto LAB_001bf7bb;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QSslCertificate *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_001bf7c4:
  __stack_chk_fail();
}

Assistant:

QList<QSslCertificate> QSslCertificate::fromData(const QByteArray &data, QSsl::EncodingFormat format)
{
    const auto *tlsBackend = QTlsBackend::activeOrAnyBackend();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend is available");
        return {};
    }

    auto reader = format == QSsl::Pem ? tlsBackend->X509PemReader() : tlsBackend->X509DerReader();
    if (!reader) {
        qCWarning(lcSsl, "The available TLS backend does not support reading PEM/DER");
        return {};
    }

    return reader(data, -1);
}